

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

int __thiscall btSoftBody::generateBendingConstraints(btSoftBody *this,int distance,Material *mat)

{
  undefined1 *puVar1;
  Node *pNVar2;
  Link *pLVar3;
  int *piVar4;
  NodeLinks *pNVar5;
  uint uVar6;
  int iVar7;
  undefined4 *puVar8;
  int *piVar9;
  uint *puVar10;
  undefined4 *puVar11;
  long lVar12;
  long lVar13;
  uint *puVar14;
  ulong uVar15;
  undefined4 *puVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  undefined4 *puVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  undefined4 uVar26;
  int iVar27;
  ulong uVar28;
  btAlignedObjectArray<NodeLinks> nodeLinks;
  int *local_a0;
  btAlignedObjectArray<NodeLinks> local_78;
  btAlignedObjectArray<int> local_58;
  
  iVar7 = 0;
  if (1 < distance) {
    iVar7 = (this->m_nodes).m_size;
    uVar28 = (ulong)iVar7;
    puVar8 = (undefined4 *)operator_new__((ulong)(uint)(iVar7 * iVar7) << 2);
    if (0 < (long)uVar28) {
      uVar19 = 0;
      puVar11 = puVar8;
      puVar16 = puVar8;
      do {
        uVar25 = 0;
        puVar22 = puVar11;
        do {
          uVar26 = 0x7fffffff;
          if (uVar19 == uVar25) {
            uVar26 = 0;
          }
          *puVar22 = uVar26;
          puVar16[uVar25] = uVar26;
          uVar25 = uVar25 + 1;
          puVar22 = puVar22 + uVar28;
        } while (uVar28 != uVar25);
        uVar19 = uVar19 + 1;
        puVar16 = puVar16 + uVar28;
        puVar11 = puVar11 + 1;
      } while (uVar19 != uVar28);
    }
    lVar12 = (long)(this->m_links).m_size;
    if (0 < lVar12) {
      pNVar2 = (this->m_nodes).m_data;
      pLVar3 = (this->m_links).m_data;
      lVar17 = 0;
      do {
        iVar21 = (int)((ulong)(*(long *)((long)pLVar3->m_n + lVar17) - (long)pNVar2) >> 3) *
                 -0x11111111;
        iVar23 = (int)((ulong)(*(long *)((long)pLVar3->m_n + lVar17 + 8) - (long)pNVar2) >> 3) *
                 -0x11111111;
        puVar8[iVar7 * iVar23 + iVar21] = 1;
        puVar8[iVar21 * iVar7 + iVar23] = 1;
        lVar17 = lVar17 + 0x48;
      } while (lVar12 * 0x48 != lVar17);
    }
    if (distance == 2) {
      local_78.m_ownsMemory = true;
      local_78.m_data = (NodeLinks *)0x0;
      local_78.m_size = 0;
      local_78.m_capacity = 0;
      local_58._0_4_ = 0;
      local_58._12_4_ = 0;
      local_58.m_ownsMemory = true;
      local_58._25_7_ = 0;
      local_58.m_data = (int *)0x0;
      local_58.m_size = 0;
      local_58.m_capacity = 0;
      btAlignedObjectArray<NodeLinks>::resize(&local_78,iVar7,(NodeLinks *)&local_58);
      btAlignedObjectArray<int>::~btAlignedObjectArray(&local_58);
      if (0 < (this->m_links).m_size) {
        lVar12 = 0;
        do {
          pNVar5 = local_78.m_data;
          pNVar2 = (this->m_nodes).m_data;
          pLVar3 = (this->m_links).m_data;
          iVar21 = (int)((long)pLVar3[lVar12].m_n[0] - (long)pNVar2 >> 3) * -0x11111111;
          iVar23 = (int)((long)pLVar3[lVar12].m_n[1] - (long)pNVar2 >> 3) * -0x11111111;
          uVar24 = local_78.m_data[iVar21].m_links.m_size;
          if (0 < (int)uVar24) {
            uVar19 = 0;
            do {
              if (local_78.m_data[iVar21].m_links.m_data[uVar19] == iVar23) goto LAB_001de10c;
              uVar19 = uVar19 + 1;
            } while (uVar24 != uVar19);
          }
          uVar19 = (ulong)uVar24;
LAB_001de10c:
          if ((uint)uVar19 == uVar24) {
            uVar6 = local_78.m_data[iVar21].m_links.m_capacity;
            if (uVar24 == uVar6) {
              iVar27 = uVar24 * 2;
              if ((ulong)uVar24 == 0) {
                iVar27 = 1;
              }
              if ((int)uVar6 < iVar27) {
                if (iVar27 == 0) {
                  local_a0 = (int *)0x0;
                }
                else {
                  local_a0 = (int *)btAlignedAllocInternal((long)iVar27 << 2,0x10);
                }
                lVar17 = (long)pNVar5[iVar21].m_links.m_size;
                if (0 < lVar17) {
                  piVar9 = pNVar5[iVar21].m_links.m_data;
                  lVar13 = 0;
                  do {
                    local_a0[lVar13] = piVar9[lVar13];
                    lVar13 = lVar13 + 1;
                  } while (lVar17 != lVar13);
                }
                piVar9 = pNVar5[iVar21].m_links.m_data;
                if (piVar9 != (int *)0x0) {
                  if (pNVar5[iVar21].m_links.m_ownsMemory == true) {
                    btAlignedFreeInternal(piVar9);
                  }
                  pNVar5[iVar21].m_links.m_data = (int *)0x0;
                }
                pNVar5[iVar21].m_links.m_ownsMemory = true;
                pNVar5[iVar21].m_links.m_data = local_a0;
                pNVar5[iVar21].m_links.m_capacity = iVar27;
              }
            }
            pNVar5[iVar21].m_links.m_data[pNVar5[iVar21].m_links.m_size] = iVar23;
            piVar9 = &pNVar5[iVar21].m_links.m_size;
            *piVar9 = *piVar9 + 1;
          }
          pNVar5 = local_78.m_data;
          uVar24 = local_78.m_data[iVar23].m_links.m_size;
          if (0 < (int)uVar24) {
            uVar19 = 0;
            do {
              if (local_78.m_data[iVar23].m_links.m_data[uVar19] == iVar21) goto LAB_001de21b;
              uVar19 = uVar19 + 1;
            } while (uVar24 != uVar19);
          }
          uVar19 = (ulong)uVar24;
LAB_001de21b:
          if ((uint)uVar19 == uVar24) {
            uVar6 = local_78.m_data[iVar23].m_links.m_capacity;
            if (uVar24 == uVar6) {
              iVar27 = uVar24 * 2;
              if ((ulong)uVar24 == 0) {
                iVar27 = 1;
              }
              if ((int)uVar6 < iVar27) {
                if (iVar27 == 0) {
                  piVar9 = (int *)0x0;
                }
                else {
                  piVar9 = (int *)btAlignedAllocInternal((long)iVar27 << 2,0x10);
                }
                lVar17 = (long)pNVar5[iVar23].m_links.m_size;
                if (0 < lVar17) {
                  piVar4 = pNVar5[iVar23].m_links.m_data;
                  lVar13 = 0;
                  do {
                    piVar9[lVar13] = piVar4[lVar13];
                    lVar13 = lVar13 + 1;
                  } while (lVar17 != lVar13);
                }
                piVar4 = pNVar5[iVar23].m_links.m_data;
                if (piVar4 != (int *)0x0) {
                  if (pNVar5[iVar23].m_links.m_ownsMemory == true) {
                    btAlignedFreeInternal(piVar4);
                  }
                  pNVar5[iVar23].m_links.m_data = (int *)0x0;
                }
                pNVar5[iVar23].m_links.m_ownsMemory = true;
                pNVar5[iVar23].m_links.m_data = piVar9;
                pNVar5[iVar23].m_links.m_capacity = iVar27;
              }
            }
            pNVar5[iVar23].m_links.m_data[pNVar5[iVar23].m_links.m_size] = iVar21;
            piVar9 = &pNVar5[iVar23].m_links.m_size;
            *piVar9 = *piVar9 + 1;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < (this->m_links).m_size);
      }
      if (0 < (long)local_78.m_size) {
        uVar19 = 0;
        do {
          if (0 < local_78.m_data[uVar19].m_links.m_size) {
            piVar9 = local_78.m_data[uVar19].m_links.m_data;
            lVar12 = 0;
            do {
              iVar21 = piVar9[lVar12];
              if (0 < local_78.m_data[iVar21].m_links.m_size) {
                piVar4 = local_78.m_data[iVar21].m_links.m_data;
                lVar17 = 0;
                do {
                  uVar24 = piVar4[lVar17];
                  if (uVar19 != uVar24) {
                    uVar6 = puVar8[(int)(iVar7 * uVar24 + iVar21)] +
                            puVar8[iVar7 * iVar21 + (int)uVar19];
                    iVar23 = iVar7 * uVar24 + (int)uVar19;
                    if (uVar6 < (uint)puVar8[iVar23]) {
                      puVar8[uVar19 * uVar28 + (long)(int)uVar24] = uVar6;
                      puVar8[iVar23] = uVar6;
                    }
                  }
                  lVar17 = lVar17 + 1;
                } while (lVar17 < local_78.m_data[iVar21].m_links.m_size);
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < local_78.m_data[uVar19].m_links.m_size);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != (long)local_78.m_size);
      }
      btAlignedObjectArray<NodeLinks>::~btAlignedObjectArray(&local_78);
    }
    else if (0 < iVar7) {
      uVar19 = 0;
      puVar11 = puVar8 + 1;
      do {
        puVar10 = puVar8 + uVar28;
        uVar18 = 0;
        puVar16 = puVar8 + 1;
        puVar22 = puVar11;
        uVar25 = uVar28;
        do {
          uVar25 = uVar25 - 1;
          uVar15 = uVar18 + 1;
          if (uVar15 < uVar28) {
            uVar20 = 0;
            puVar14 = puVar10;
            do {
              uVar24 = puVar8[uVar19 + uVar18 * uVar28] + puVar22[uVar20];
              if (uVar24 < (uint)puVar16[uVar20]) {
                *puVar14 = uVar24;
                puVar16[uVar20] = uVar24;
              }
              uVar20 = uVar20 + 1;
              puVar14 = puVar14 + uVar28;
            } while (uVar25 != uVar20);
          }
          puVar16 = puVar16 + uVar28 + 1;
          puVar22 = puVar22 + 1;
          puVar10 = puVar10 + uVar28 + 1;
          uVar18 = uVar15;
        } while (uVar15 != uVar28);
        uVar19 = uVar19 + 1;
        puVar11 = puVar11 + uVar28;
      } while (uVar19 != uVar28);
    }
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    else {
      lVar12 = 0x78;
      iVar7 = 0;
      uVar19 = 0;
      uVar25 = uVar28;
      puVar11 = puVar8;
      do {
        uVar18 = uVar19 + 1;
        if (uVar18 < uVar28) {
          uVar15 = 1;
          lVar17 = lVar12;
          do {
            if (puVar11[uVar15] == distance) {
              pNVar2 = (this->m_nodes).m_data;
              appendLink(this,(Node *)((long)&(((Node *)(&pNVar2->m_x + -1))->super_Feature).
                                              super_Element.m_tag + lVar17),pNVar2 + uVar19,mat,
                         false);
              puVar1 = &(this->m_links).m_data[(long)(this->m_links).m_size + -1].field_0x24;
              *puVar1 = *puVar1 | 1;
              iVar7 = iVar7 + 1;
            }
            uVar15 = uVar15 + 1;
            lVar17 = lVar17 + 0x78;
          } while (uVar25 != uVar15);
        }
        puVar11 = puVar11 + uVar28 + 1;
        lVar12 = lVar12 + 0x78;
        uVar25 = uVar25 - 1;
        uVar19 = uVar18;
      } while (uVar18 != uVar28);
    }
    operator_delete__(puVar8);
  }
  return iVar7;
}

Assistant:

int				btSoftBody::generateBendingConstraints(int distance,Material* mat)
{
	int i,j;

	if(distance>1)
	{
		/* Build graph	*/ 
		const int		n=m_nodes.size();
		const unsigned	inf=(~(unsigned)0)>>1;
		unsigned*		adj=new unsigned[n*n];
		

#define IDX(_x_,_y_)	((_y_)*n+(_x_))
		for(j=0;j<n;++j)
		{
			for(i=0;i<n;++i)
			{
				if(i!=j)
				{
					adj[IDX(i,j)]=adj[IDX(j,i)]=inf;
				}
				else
				{
					adj[IDX(i,j)]=adj[IDX(j,i)]=0;
				}
			}
		}
		for( i=0;i<m_links.size();++i)
		{
			const int	ia=(int)(m_links[i].m_n[0]-&m_nodes[0]);
			const int	ib=(int)(m_links[i].m_n[1]-&m_nodes[0]);
			adj[IDX(ia,ib)]=1;
			adj[IDX(ib,ia)]=1;
		}


		//special optimized case for distance == 2
		if (distance == 2)
		{

			btAlignedObjectArray<NodeLinks> nodeLinks;


			/* Build node links */
			nodeLinks.resize(m_nodes.size());

			for( i=0;i<m_links.size();++i)
			{
				const int	ia=(int)(m_links[i].m_n[0]-&m_nodes[0]);
				const int	ib=(int)(m_links[i].m_n[1]-&m_nodes[0]);
				if (nodeLinks[ia].m_links.findLinearSearch(ib)==nodeLinks[ia].m_links.size())
					nodeLinks[ia].m_links.push_back(ib);

				if (nodeLinks[ib].m_links.findLinearSearch(ia)==nodeLinks[ib].m_links.size())
					nodeLinks[ib].m_links.push_back(ia);
			}
			for (int ii=0;ii<nodeLinks.size();ii++)
			{
				int i=ii;

				for (int jj=0;jj<nodeLinks[ii].m_links.size();jj++)
				{
					int k = nodeLinks[ii].m_links[jj];
					for (int kk=0;kk<nodeLinks[k].m_links.size();kk++)
					{
						int j = nodeLinks[k].m_links[kk];
						if (i!=j)
						{
							const unsigned	sum=adj[IDX(i,k)]+adj[IDX(k,j)];
							btAssert(sum==2);
							if(adj[IDX(i,j)]>sum)
							{
								adj[IDX(i,j)]=adj[IDX(j,i)]=sum;
							}
						}

					}
				}
			}
		} else
		{
			///generic Floyd's algorithm
			for(int k=0;k<n;++k)
			{
				for(j=0;j<n;++j)
				{
					for(i=j+1;i<n;++i)
					{
						const unsigned	sum=adj[IDX(i,k)]+adj[IDX(k,j)];
						if(adj[IDX(i,j)]>sum)
						{
							adj[IDX(i,j)]=adj[IDX(j,i)]=sum;
						}
					}
				}
			}
		}


		/* Build links	*/ 
		int	nlinks=0;
		for(j=0;j<n;++j)
		{
			for(i=j+1;i<n;++i)
			{
				if(adj[IDX(i,j)]==(unsigned)distance)
				{
					appendLink(i,j,mat);
					m_links[m_links.size()-1].m_bbending=1;
					++nlinks;
				}
			}
		}
		delete[] adj;		
		return(nlinks);
	}
	return(0);
}